

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O1

int __thiscall
Decrypt::decrypt(Decrypt *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  EVP_PKEY_CTX *__x;
  EVP_PKEY_CTX *__x_00;
  deque<int,_std::allocator<int>_> *pdVar1;
  deque<int,_std::allocator<int>_> *pdVar2;
  deque<int,_std::allocator<int>_> *this_00;
  deque<int,_std::allocator<int>_> *this_01;
  DESinv d2;
  DES c;
  DESinv d1;
  SequenceD<64> local_500;
  SequenceD<64> local_450;
  SequenceD<64> local_3a0;
  SequenceD<64> local_2f0;
  SequenceD<64> local_240;
  SequenceD<64> local_190;
  DESinv local_e0;
  
  DESinv::DESinv(&local_e0,&this->m_k1);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  __x = ctx + 8;
  std::deque<int,_std::allocator<int>_>::deque
            (&local_2f0.super_Sequence.m_bits,(deque<int,_std::allocator<int>_> *)__x);
  pdVar1 = &local_2f0.m_other.m_bits;
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_2f0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  __x_00 = ctx + 0x60;
  std::deque<int,_std::allocator<int>_>::deque(pdVar1,(deque<int,_std::allocator<int>_> *)__x_00);
  DESinv::operator()(&local_450,&local_e0,&local_2f0);
  std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)__x,&local_450.super_Sequence.m_bits);
  pdVar2 = &local_450.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)__x_00,pdVar2);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_450.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_2f0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar1->super__Deque_base<int,_std::allocator<int>_>);
  local_2f0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2f0.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  DES::DES((DES *)&local_450,&this->m_k2);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque
            (&local_3a0.super_Sequence.m_bits,(deque<int,_std::allocator<int>_> *)__x);
  pdVar2 = &local_3a0.m_other.m_bits;
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_3a0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar2,(deque<int,_std::allocator<int>_> *)__x_00);
  DES::operator()(&local_500,(DES *)&local_450,&local_3a0);
  std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)__x,&local_500.super_Sequence.m_bits);
  pdVar1 = &local_500.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)__x_00,pdVar1);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_500.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar1->super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_3a0.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_3a0.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_3a0.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  DESinv::DESinv((DESinv *)&local_500,&this->m_k1);
  pdVar1 = &local_240.super_Sequence.m_bits;
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar1,(deque<int,_std::allocator<int>_> *)__x);
  pdVar2 = &local_240.m_other.m_bits;
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_240.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(pdVar2,(deque<int,_std::allocator<int>_> *)__x_00);
  DESinv::operator()(&local_190,(DESinv *)&local_500,&local_240);
  this_00 = &local_190.super_Sequence.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=((deque<int,_std::allocator<int>_> *)__x,this_00);
  this_01 = &local_190.m_other.m_bits;
  std::deque<int,_std::allocator<int>_>::operator=
            ((deque<int,_std::allocator<int>_> *)__x_00,this_01);
  local_190.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_190.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&this_01->super__Deque_base<int,_std::allocator<int>_>);
  local_190.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&this_00->super__Deque_base<int,_std::allocator<int>_>);
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_240.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar2->super__Deque_base<int,_std::allocator<int>_>);
  local_240.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&pdVar1->super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_500.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_500.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_500.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_450.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_450.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_450.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_e0.m_key.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116cc8;
  local_e0.m_key.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_e0.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_e0.m_key.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_e0.m_key.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  return (int)ctx;
}

Assistant:

SequenceD<64> &Decrypt::decrypt(SequenceD<64> &seq) {
    DESinv d1(m_k1);
    seq = d1(seq);
    DES c(m_k2);
    seq = c(seq);
    DESinv d2(m_k1);
    seq = d2(seq);
    return seq;
}